

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O2

bool __thiscall
tonk::SDKConnectionList<MyServerConnection>::Insert
          (SDKConnectionList<MyServerConnection> *this,SDKConnection *connection)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  shared_ptr<tonk::SDKConnection> *ii;
  shared_ptr<tonk::SDKConnection> local_40;
  
  std::mutex::lock(&this->ConnectionListLock);
  psVar1 = (this->ConnectionList).
           super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->ConnectionList).
           super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar3 = psVar2;
    if (psVar3 == psVar1) {
      std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<tonk::SDKConnection,void>
                ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &connection->super_enable_shared_from_this<tonk::SDKConnection>);
      std::
      vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>
      ::emplace_back<std::shared_ptr<tonk::SDKConnection>>
                ((vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>
                  *)&this->ConnectionList,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      break;
    }
    psVar2 = psVar3 + 1;
  } while ((psVar3->super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
           connection);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return psVar3 == psVar1;
}

Assistant:

bool Insert(SDKConnection* connection)
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);
        for (auto& ii : ConnectionList)
            if (ii.get() == connection)
                return false;
        ConnectionList.push_back(connection->shared_from_this());
        return true;
    }